

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O1

void InitThingdef(void)

{
  long lVar1;
  long *plVar2;
  void *pvVar3;
  FPropertyInfo *pFVar4;
  _func_int **pp_Var5;
  undefined8 *puVar6;
  char *pcVar7;
  char *pcVar8;
  VMNativeFunction **ppVVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  AFuncDesc *pAVar12;
  FieldDesc *pFVar13;
  PClass *pPVar14;
  AFuncDesc *pAVar15;
  FieldDesc *pFVar16;
  int iVar17;
  PPointer *pPVar18;
  PType *pPVar19;
  PField *pPVar20;
  PArray *pPVar21;
  PNativeStruct *pPVar22;
  PInt **ppPVar23;
  DObject *this;
  ulong uVar24;
  long lVar25;
  void **ppvVar26;
  long lVar27;
  FieldDesc *afield;
  long lVar28;
  FString local_a0;
  int local_98;
  FName local_94;
  _func_int **local_90;
  DObject *local_88;
  _func_int **local_80;
  int local_74;
  FName local_70;
  FName local_6c;
  FName local_68;
  FName local_64;
  int local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  int local_38;
  FName local_34;
  
  pPVar18 = NewPointer((PType *)AActor::RegistrationInfo.MyClass,false);
  local_34.Index = FName::NameManager::FindName(&FName::NameData,"Sector",false);
  pPVar19 = (PType *)NewNativeStruct(&local_34,(PTypeBase *)0x0);
  NewPointer(pPVar19,false);
  local_38 = FName::NameManager::FindName(&FName::NameData,"soundtarget",false);
  (*(pPVar19->super_PTypeBase).super_DObject._vptr_DObject[0x16])(pPVar19,&local_38,pPVar18,0x108,0)
  ;
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_3c.Index = FName::NameManager::FindName(&FName::NameData,"validcount",false);
  PField::PField(pPVar20,&local_3c,(PType *)TypeSInt32,0x2008,0x71f6dc,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_40.Index = FName::NameManager::FindName(&FName::NameData,"multiplayer",false);
  PField::PField(pPVar20,&local_40,(PType *)TypeBool,0x2018,0x17e5e4b,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  local_44.Index = FName::NameManager::FindName(&FName::NameData,"LevelLocals",false);
  pPVar19 = (PType *)NewNativeStruct(&local_44,(PTypeBase *)0x0);
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_48.Index = FName::NameManager::FindName(&FName::NameData,"level",false);
  PField::PField(pPVar20,&local_48,pPVar19,0x2008,0x17e8180,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  local_4c.Index = FName::NameManager::FindName(&FName::NameData,"DehInfo",false);
  pPVar19 = (PType *)NewNativeStruct(&local_4c,(PTypeBase *)0x0);
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_50.Index = FName::NameManager::FindName(&FName::NameData,"deh",false);
  PField::PField(pPVar20,&local_50,pPVar19,0x2008,0x71b350,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  local_54.Index = FName::NameManager::FindName(&FName::NameData,"PlayerInfo",false);
  pPVar19 = (PType *)NewNativeStruct(&local_54,(PTypeBase *)0x0);
  *(undefined8 *)&(pPVar19->super_PTypeBase).super_DObject.field_0x24 = 0x8000002a0;
  pPVar21 = NewArray(pPVar19,8);
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_58.Index = FName::NameManager::FindName(&FName::NameData,"players",false);
  PField::PField(pPVar20,&local_58,(PType *)pPVar21,0x2008,0x17e5e50,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  local_5c.Index = FName::NameManager::FindName(&FName::NameData,"Sector",false);
  pPVar22 = NewNativeStruct(&local_5c,(PTypeBase *)0x0);
  local_60 = FName::NameManager::FindName(&FName::NameData,"lines",false);
  local_64.Index = FName::NameManager::FindName(&FName::NameData,"line",false);
  pPVar19 = (PType *)NewNativeStruct(&local_64,(PTypeBase *)0x0);
  pPVar18 = NewPointer(pPVar19,false);
  pPVar21 = NewArray((PType *)pPVar18,0x40000);
  pPVar18 = NewPointer((PType *)pPVar21,false);
  (**(code **)((long)(pPVar22->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                     super_PTypeBase.super_DObject._vptr_DObject + 0xb0))
            (pPVar22,&local_60,pPVar18,0x1a0,8);
  pPVar21 = NewArray((PType *)TypeBool,8);
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_68.Index = FName::NameManager::FindName(&FName::NameData,"playeringame",false);
  PField::PField(pPVar20,&local_68,(PType *)pPVar21,0x2018,0x17e7350,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_6c.Index = FName::NameManager::FindName(&FName::NameData,"gameaction",false);
  PField::PField(pPVar20,&local_6c,(PType *)TypeUInt8,0x2008,0x17e5e38,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_70.Index = FName::NameManager::FindName(&FName::NameData,"consoleplayer",false);
  PField::PField(pPVar20,&local_70,(PType *)TypeSInt32,0x2018,0x17e7358,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  if (InitThingdef()::wpnochg == '\0') {
    InitThingdef();
  }
  pPVar20 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  local_94.Index = FName::NameManager::FindName(&FName::NameData,"WP_NOCHANGE",false);
  pPVar18 = NewPointer((PType *)AWeapon::RegistrationInfo.MyClass,false);
  PField::PField(pPVar20,&local_94,(PType *)pPVar18,0x2018,0x1c7ad70,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar20);
  pPVar14 = AActor::RegistrationInfo.MyClass;
  local_74 = FName::NameManager::FindName(&FName::NameData,"DecalGenerator",false);
  pPVar18 = NewPointer(&TypeVoid->super_PType,false);
  (**(code **)(*(long *)&(pPVar14->super_PNativeStruct).super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0xb0))
            (pPVar14,&local_74,pPVar18,0x478,0,0);
  lVar28 = 0;
  do {
    if (((*(byte *)((long)&FlagLists[0].Use + lVar28) & 2) != 0) &&
       (lVar25 = (long)*(int *)((long)&FlagLists[0].NumDefs + lVar28), 0 < lVar25)) {
      lVar1 = *(long *)((long)&FlagLists[0].Defs + lVar28);
      lVar27 = 0;
      do {
        if (0 < *(int *)(lVar1 + 0x10 + lVar27)) {
          plVar2 = (long *)**(undefined8 **)((long)&FlagLists[0].Type + lVar28);
          FStringf::FStringf((FStringf *)&local_a0,"b%s",*(undefined8 *)(lVar1 + 8 + lVar27));
          local_98 = FName::NameManager::FindName
                               (&FName::NameData,local_a0.Chars,
                                (ulong)*(uint *)(local_a0.Chars + -0xc),false);
          ppPVar23 = &TypeSInt16;
          if (*(int *)(lVar1 + 0x14 + lVar27) == 4) {
            ppPVar23 = &TypeSInt32;
          }
          (**(code **)(*plVar2 + 0xb0))
                    (plVar2,&local_98,*ppPVar23,(long)*(int *)(lVar1 + 0x10 + lVar27),
                     *(undefined4 *)(lVar1 + 0x18 + lVar27),*(undefined4 *)(lVar1 + lVar27));
          FString::~FString(&local_a0);
        }
        lVar27 = lVar27 + 0x20;
      } while (lVar25 * 0x20 != lVar27);
    }
    lVar28 = lVar28 + 0x18;
  } while (lVar28 != 0xa8);
  ppvVar26 = &CRegHead;
  while( true ) {
    do {
      ppvVar26 = ppvVar26 + 1;
      pvVar3 = *ppvVar26;
    } while (ppvVar26 < &CRegTail && pvVar3 == (void *)0x0);
    if (pvVar3 == (void *)0x0) break;
    if (*(code **)((long)pvVar3 + 0x30) != (code *)0x0) {
      (**(code **)((long)pvVar3 + 0x30))();
    }
  }
  lVar28 = 0x10;
  do {
    qsort(*(void **)(&UNK_0070f268 + lVar28),(long)*(int *)((long)&FlagLists[0].Type + lVar28),0x20,
          flagcmp);
    lVar28 = lVar28 + 0x18;
  } while (lVar28 != 0xb8);
  if (properties.Count == 0) {
    ppvVar26 = &GRegHead;
    while( true ) {
      do {
        ppvVar26 = ppvVar26 + 1;
        pFVar4 = (FPropertyInfo *)*ppvVar26;
      } while (ppvVar26 <= (void **)((long)&infoptr_respawns_0_FakeInventory + 7) &&
               pFVar4 == (FPropertyInfo *)0x0);
      if (pFVar4 == (FPropertyInfo *)0x0) break;
      TArray<FPropertyInfo_*,_FPropertyInfo_*>::Grow(&properties,1);
      properties.Array[properties.Count] = pFVar4;
      properties.Count = properties.Count + 1;
    }
    TArray<FPropertyInfo_*,_FPropertyInfo_*>::ShrinkToFit(&properties);
    qsort(properties.Array,(ulong)properties.Count,8,propcmp);
  }
  if (AFTable.Count != 0) {
    AFTable.Count = 0;
  }
  if (AFTable.Count == 0) {
    ppvVar26 = &ARegHead;
    local_80 = (_func_int **)&PTR_StaticType_00714038;
    local_88 = (DObject *)FString::NullString.Nothing;
    local_90 = (_func_int **)&PTR_StaticType_00714098;
    while( true ) {
      do {
        ppvVar26 = ppvVar26 + 1;
        plVar2 = (long *)*ppvVar26;
      } while (ppvVar26 <= (void **)((long)&FString_Replace_HookPtr + 7) && plVar2 == (long *)0x0);
      if (plVar2 == (long *)0x0) break;
      if (plVar2[3] == 0) {
        __assert_fail("afunc->VMPointer != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                      ,0x323,"void InitThingdef()");
      }
      this = (DObject *)
             M_Malloc_Dbg(0x58,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                          ,0x1f9);
      pp_Var5 = (_func_int **)plVar2[2];
      iVar17 = FName::NameManager::FindName(&FName::NameData,(char *)plVar2[1],false);
      DObject::DObject(this);
      this->_vptr_DObject = local_80;
      *(undefined8 *)&this->field_0x24 = 0xffffffff00000000;
      *(int *)((long)&this[1]._vptr_DObject + 4) = iVar17;
      this[1].Class = (PClass *)0x0;
      this[1].ObjNext = (DObject *)0x0;
      this[1].GCNext = local_88;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      *(undefined8 *)&this[1].ObjectFlags = 0;
      this->_vptr_DObject = local_90;
      this[2]._vptr_DObject = pp_Var5;
      this->field_0x24 = 1;
      *(DObject **)plVar2[3] = this;
      FString::Format((FString *)(*(long *)plVar2[3] + 0x40),"%s.%s [Native]",*plVar2 + 1,plVar2[1])
      ;
      TArray<AFuncDesc,_AFuncDesc>::Grow(&AFTable,1);
      pAVar15 = AFTable.Array;
      uVar24 = (ulong)AFTable.Count;
      AFTable.Count = AFTable.Count + 1;
      pcVar7 = (char *)*plVar2;
      pcVar8 = (char *)plVar2[1];
      ppVVar9 = (VMNativeFunction **)plVar2[3];
      pAVar12 = AFTable.Array + uVar24;
      pAVar12->Function = (actionf_p)plVar2[2];
      (&pAVar12->Function)[1] = (actionf_p)ppVVar9;
      pAVar15[uVar24].ClassName = pcVar7;
      pAVar15[uVar24].FuncName = pcVar8;
    }
    TArray<AFuncDesc,_AFuncDesc>::ShrinkToFit(&AFTable);
    qsort(AFTable.Array,(ulong)AFTable.Count,0x20,funccmp);
  }
  if (FieldTable.Count != 0) {
    FieldTable.Count = 0;
  }
  if (FieldTable.Count == 0) {
    ppvVar26 = &FRegHead;
    while( true ) {
      do {
        ppvVar26 = ppvVar26 + 1;
        puVar6 = (undefined8 *)*ppvVar26;
      } while (ppvVar26 <= (void **)((long)&VMField_AFakeInventory_Respawnable_HookPtr + 7) &&
               puVar6 == (undefined8 *)0x0);
      if (puVar6 == (undefined8 *)0x0) break;
      TArray<FieldDesc,_FieldDesc>::Grow(&FieldTable,1);
      pFVar16 = FieldTable.Array;
      uVar24 = (ulong)FieldTable.Count;
      FieldTable.Count = FieldTable.Count + 1;
      pcVar7 = (char *)*puVar6;
      pcVar8 = (char *)puVar6[1];
      uVar10 = puVar6[2];
      uVar11 = puVar6[3];
      pFVar13 = FieldTable.Array + uVar24;
      pFVar13->FieldOffset = (int)uVar10;
      pFVar13->FieldSize = (int)((ulong)uVar10 >> 0x20);
      *(undefined8 *)(&pFVar13->FieldOffset + 2) = uVar11;
      pFVar16[uVar24].ClassName = pcVar7;
      pFVar16[uVar24].FieldName = pcVar8;
    }
    TArray<FieldDesc,_FieldDesc>::ShrinkToFit(&FieldTable);
    qsort(FieldTable.Array,(ulong)FieldTable.Count,0x20,fieldcmp);
  }
  return;
}

Assistant:

void InitThingdef()
{
	PType *TypeActor = NewPointer(RUNTIME_CLASS(AActor));

	PStruct *sstruct = NewNativeStruct("Sector", nullptr);
	auto sptr = NewPointer(sstruct);
	sstruct->AddNativeField("soundtarget", TypeActor, myoffsetof(sector_t, SoundTarget));
	
	// expose the global validcount variable.
	PField *vcf = new PField("validcount", TypeSInt32, VARF_Native | VARF_Static, (intptr_t)&validcount);
	GlobalSymbols.AddSymbol(vcf);

	// expose the global Multiplayer variable.
	PField *multif = new PField("multiplayer", TypeBool, VARF_Native | VARF_ReadOnly | VARF_Static, (intptr_t)&multiplayer);
	GlobalSymbols.AddSymbol(multif);

	// set up a variable for the global level data structure
	PStruct *lstruct = NewNativeStruct("LevelLocals", nullptr);
	PField *levelf = new PField("level", lstruct, VARF_Native | VARF_Static, (intptr_t)&level);
	GlobalSymbols.AddSymbol(levelf);

	// set up a variable for the DEH data
	PStruct *dstruct = NewNativeStruct("DehInfo", nullptr);
	PField *dehf = new PField("deh", dstruct, VARF_Native | VARF_Static, (intptr_t)&deh);

	GlobalSymbols.AddSymbol(dehf);

	// set up a variable for the global players array.
	PStruct *pstruct = NewNativeStruct("PlayerInfo", nullptr);
	pstruct->Size = sizeof(player_t);
	pstruct->Align = alignof(player_t);
	PArray *parray = NewArray(pstruct, MAXPLAYERS);
	PField *playerf = new PField("players", parray, VARF_Native | VARF_Static, (intptr_t)&players);
	GlobalSymbols.AddSymbol(playerf);

	// set up the lines array in the sector struct. This is a bit messy because the type system is not prepared to handle a pointer to an array of pointers to a native struct even remotely well...
	// As a result, the size has to be set to something large and arbritrary because it can change between maps. This will need some serious improvement when things get cleaned up.
	pstruct = NewNativeStruct("Sector", nullptr);
	pstruct->AddNativeField("lines", NewPointer(NewArray(NewPointer(NewNativeStruct("line", nullptr), false), 0x40000), false), myoffsetof(sector_t, lines), VARF_Native);

	parray = NewArray(TypeBool, MAXPLAYERS);
	playerf = new PField("playeringame", parray, VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&playeringame);
	GlobalSymbols.AddSymbol(playerf);

	playerf = new PField("gameaction", TypeUInt8, VARF_Native | VARF_Static, (intptr_t)&gameaction);
	GlobalSymbols.AddSymbol(playerf);

	playerf = new PField("consoleplayer", TypeSInt32, VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&consoleplayer);
	GlobalSymbols.AddSymbol(playerf);

	// Argh. It sucks when bad hacks need to be supported. WP_NOCHANGE is just a bogus pointer but it used everywhere as a special flag.
	// It cannot be defined as constant because constants can either be numbers or strings but nothing else, so the only 'solution'
	// is to create a static variable from it and reference that in the script. Yuck!!!
	static AWeapon *wpnochg = WP_NOCHANGE;
	playerf = new PField("WP_NOCHANGE", NewPointer(RUNTIME_CLASS(AWeapon), false), VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&wpnochg);
	GlobalSymbols.AddSymbol(playerf);

	// this needs to be done manually until it can be given a proper type.
	RUNTIME_CLASS(AActor)->AddNativeField("DecalGenerator", NewPointer(TypeVoid), myoffsetof(AActor, DecalGenerator));

	// synthesize a symbol for each flag from the flag name tables to avoid redundant declaration of them.
	for (auto &fl : FlagLists)
	{
		if (fl.Use & 2)
		{
			for(int i=0;i<fl.NumDefs;i++)
			{
				if (fl.Defs[i].structoffset > 0) // skip the deprecated entries in this list
				{
					const_cast<PClass*>(*fl.Type)->AddNativeField(FStringf("b%s", fl.Defs[i].name), (fl.Defs[i].fieldsize == 4 ? TypeSInt32 : TypeSInt16), fl.Defs[i].structoffset, fl.Defs[i].varflags, fl.Defs[i].flagbit);
				}
			}
		}
	}

	FAutoSegIterator probe(CRegHead, CRegTail);

	while (*++probe != NULL)
	{
		if (((ClassReg *)*probe)->InitNatives)
			((ClassReg *)*probe)->InitNatives();
	}

	// Sort the flag lists
	for (size_t i = 0; i < NUM_FLAG_LISTS; ++i)
	{
		qsort (FlagLists[i].Defs, FlagLists[i].NumDefs, sizeof(FFlagDef), flagcmp);
	}

	// Create a sorted list of properties
	if (properties.Size() == 0)
	{
		FAutoSegIterator probe(GRegHead, GRegTail);

		while (*++probe != NULL)
		{
			properties.Push((FPropertyInfo *)*probe);
		}
		properties.ShrinkToFit();
		qsort(&properties[0], properties.Size(), sizeof(properties[0]), propcmp);
	}

	// Create a sorted list of native action functions
	AFTable.Clear();
	if (AFTable.Size() == 0)
	{
		FAutoSegIterator probe(ARegHead, ARegTail);

		while (*++probe != NULL)
		{
			AFuncDesc *afunc = (AFuncDesc *)*probe;
			assert(afunc->VMPointer != NULL);
			*(afunc->VMPointer) = new VMNativeFunction(afunc->Function, afunc->FuncName);
			(*(afunc->VMPointer))->PrintableName.Format("%s.%s [Native]", afunc->ClassName+1, afunc->FuncName);
			AFTable.Push(*afunc);
		}
		AFTable.ShrinkToFit();
		qsort(&AFTable[0], AFTable.Size(), sizeof(AFTable[0]), funccmp);
	}

	FieldTable.Clear();
	if (FieldTable.Size() == 0)
	{
		FAutoSegIterator probe(FRegHead, FRegTail);

		while (*++probe != NULL)
		{
			FieldDesc *afield = (FieldDesc *)*probe;
			FieldTable.Push(*afield);
		}
		FieldTable.ShrinkToFit();
		qsort(&FieldTable[0], FieldTable.Size(), sizeof(FieldTable[0]), fieldcmp);
	}

}